

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shm_writer.cpp
# Opt level: O0

ssize_t __thiscall diffusion::ShmWriter::write(ShmWriter *this,int __fd,void *__buf,size_t __n)

{
  ssize_t extraout_RAX;
  undefined4 in_register_00000034;
  undefined4 local_24;
  void *pvStack_20;
  Size size_prefix;
  size_t size_local;
  char *data_local;
  ShmWriter *this_local;
  
  size_local = CONCAT44(in_register_00000034,__fd);
  local_24 = SUB84(__buf,0);
  pvStack_20 = __buf;
  data_local = (char *)this;
  cyclic_write(this,(char *)&local_24,4);
  cyclic_write(this,(char *)size_local,(size_t)pvStack_20);
  commit(this);
  return extraout_RAX;
}

Assistant:

void ShmWriter::write(char const *data, std::size_t size) {
    auto size_prefix = static_cast<Size>(size);
    this->cyclic_write(reinterpret_cast<char const *>(&size_prefix), sizeof(size_prefix));
    this->cyclic_write(data, size);
    this->commit();
}